

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# normalizer2impl.cpp
# Opt level: O3

UBool __thiscall
icu_63::ReorderingBuffer::append
          (ReorderingBuffer *this,UChar *s,int32_t length,UBool isNFD,uint8_t leadCC,uint8_t trailCC
          ,UErrorCode *errorCode)

{
  int iVar1;
  Normalizer2Impl *this_00;
  UBool UVar2;
  uint16_t uVar3;
  int iVar4;
  uint8_t cc;
  UChar *pUVar5;
  UChar *pUVar6;
  long lVar7;
  uint uVar8;
  
  if (length == 0) {
    return '\x01';
  }
  iVar4 = this->remainingCapacity;
  if (iVar4 < length) {
    UVar2 = resize(this,length,errorCode);
    if (UVar2 == '\0') {
      return '\0';
    }
    iVar4 = this->remainingCapacity;
  }
  this->remainingCapacity = iVar4 - length;
  if ((leadCC != '\0') && (leadCC < this->lastCC)) {
    uVar8 = (uint)(ushort)*s;
    iVar4 = 1;
    if ((length != 1 && (uVar8 & 0xfc00) == 0xd800) && (((ushort)s[1] & 0xfc00) == 0xdc00)) {
      uVar8 = (uint)(ushort)*s * 0x400 + (uint)(ushort)s[1] + 0xfca02400;
      iVar4 = 2;
    }
    insert(this,uVar8,leadCC);
    if (iVar4 < length) {
      while( true ) {
        iVar1 = iVar4 + 1;
        uVar8 = (uint)(ushort)s[iVar4];
        if ((iVar1 != length && (uVar8 & 0xfc00) == 0xd800) &&
           (((ushort)s[iVar1] & 0xfc00) == 0xdc00)) {
          uVar8 = (uint)(ushort)s[iVar4] * 0x400 + (uint)(ushort)s[iVar1] + 0xfca02400;
          iVar1 = iVar4 + 2;
        }
        iVar4 = iVar1;
        if (length <= iVar4) break;
        this_00 = this->impl;
        if (isNFD == '\0') {
          uVar3 = Normalizer2Impl::getNorm16(this_00,uVar8);
          if (uVar3 < 0xfc00) {
            cc = '\0';
            if ((this_00->minNoNo <= uVar3) && (uVar3 < this_00->limitNoNo)) {
              if ((*(byte *)((long)this_00->extraData + (ulong)(uVar3 & 0xfffe)) & 0x80) == 0) {
                cc = '\0';
              }
              else {
                cc = (uint8_t)this_00->extraData[(ulong)(uVar3 >> 1) - 1];
              }
            }
          }
          else {
            cc = (uint8_t)(uVar3 >> 1);
          }
        }
        else {
          uVar3 = Normalizer2Impl::getRawNorm16(this_00,uVar8);
          cc = (uint8_t)(uVar3 >> 1);
          if (uVar3 < 0xfc00) {
            cc = '\0';
          }
        }
        append(this,uVar8,cc,errorCode);
      }
      append(this,uVar8,trailCC,errorCode);
    }
    return '\x01';
  }
  if (trailCC < 2) {
    pUVar5 = this->limit;
    pUVar6 = pUVar5 + length;
  }
  else {
    pUVar5 = this->limit;
    if (1 < leadCC) goto LAB_00293490;
    pUVar6 = pUVar5 + 1;
  }
  this->reorderStart = pUVar6;
LAB_00293490:
  lVar7 = 0;
  do {
    *(undefined2 *)((long)pUVar5 + lVar7) = *(undefined2 *)((long)s + lVar7);
    lVar7 = lVar7 + 2;
  } while ((long)length * 2 != lVar7);
  this->limit = (UChar *)((long)pUVar5 + lVar7);
  this->lastCC = trailCC;
  return '\x01';
}

Assistant:

UBool ReorderingBuffer::append(const UChar *s, int32_t length, UBool isNFD,
                               uint8_t leadCC, uint8_t trailCC,
                               UErrorCode &errorCode) {
    if(length==0) {
        return TRUE;
    }
    if(remainingCapacity<length && !resize(length, errorCode)) {
        return FALSE;
    }
    remainingCapacity-=length;
    if(lastCC<=leadCC || leadCC==0) {
        if(trailCC<=1) {
            reorderStart=limit+length;
        } else if(leadCC<=1) {
            reorderStart=limit+1;  // Ok if not a code point boundary.
        }
        const UChar *sLimit=s+length;
        do { *limit++=*s++; } while(s!=sLimit);
        lastCC=trailCC;
    } else {
        int32_t i=0;
        UChar32 c;
        U16_NEXT(s, i, length, c);
        insert(c, leadCC);  // insert first code point
        while(i<length) {
            U16_NEXT(s, i, length, c);
            if(i<length) {
                if (isNFD) {
                    leadCC = Normalizer2Impl::getCCFromYesOrMaybe(impl.getRawNorm16(c));
                } else {
                    leadCC = impl.getCC(impl.getNorm16(c));
                }
            } else {
                leadCC=trailCC;
            }
            append(c, leadCC, errorCode);
        }
    }
    return TRUE;
}